

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O3

void __thiscall SpanList::pop(SpanList *this,Span *pSpan)

{
  Span *pSVar1;
  Span *pSVar2;
  Span *tmp;
  Span *pSVar3;
  
  pSVar1 = this->list;
  if (pSpan != (Span *)0x0 && pSVar1 != (Span *)0x0) {
    if (pSVar1 == pSpan) {
      pSVar3 = pSVar1->next;
      if (pSVar3 == pSpan) {
        pSVar3 = (Span *)0x0;
      }
      else {
        pSVar2 = pSVar1->prev;
        pSVar2->next = pSVar3;
        pSVar1->next->prev = pSVar2;
      }
      this->list = pSVar3;
      return;
    }
    pSVar1 = pSpan->next;
    pSVar3 = pSpan->prev;
    pSVar3->next = pSVar1;
    pSVar1->prev = pSVar3;
  }
  return;
}

Assistant:

void SpanList::pop(Span *pSpan) {
  // 当链表为空 时
  if (list == nullptr || pSpan == nullptr) {
    return;
  }
  if (list == pSpan) { // 当pSpan是链表头时, 可调用其他接口直接实现.
                       // 这种情况也包含了只有一个元素的情况
    this->popFront();
  } else { // 当节点在链表的其他部位时
    pSpan->prev->next = pSpan->next;
    pSpan->next->prev = pSpan->prev;
  }
}